

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmap-file-view-factory-impl.cpp
# Opt level: O0

void __thiscall
yactfr::internal::MmapFileViewFactoryImpl::~MmapFileViewFactoryImpl(MmapFileViewFactoryImpl *this)

{
  MmapFileViewFactoryImpl *this_local;
  
  _close(this);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

MmapFileViewFactoryImpl::~MmapFileViewFactoryImpl()
{
    this->_close();
}